

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.pb.cc
# Opt level: O1

void __thiscall google::protobuf::EnumValue::EnumValue(EnumValue *this,EnumValue *from)

{
  InternalMetadata *this_00;
  void *pvVar1;
  string *initial_value;
  Arena *arena;
  
  (this->super_Message).super_MessageLite._internal_metadata_.ptr_ = (void *)0x0;
  (this->super_Message).super_MessageLite._vptr_MessageLite = (_func_int **)&PTR__EnumValue_003c88e8
  ;
  (this->options_).super_RepeatedPtrFieldBase.arena_ = (Arena *)0x0;
  (this->options_).super_RepeatedPtrFieldBase.current_size_ = 0;
  (this->options_).super_RepeatedPtrFieldBase.total_size_ = 0;
  (this->options_).super_RepeatedPtrFieldBase.rep_ = (Rep *)0x0;
  internal::RepeatedPtrFieldBase::
  MergeFrom<google::protobuf::RepeatedPtrField<google::protobuf::Option>::TypeHandler>
            (&(this->options_).super_RepeatedPtrFieldBase,
             &(from->options_).super_RepeatedPtrFieldBase);
  this_00 = &(this->super_Message).super_MessageLite._internal_metadata_;
  (this->_cached_size_).size_.super___atomic_base<int>._M_i = 0;
  pvVar1 = (from->super_Message).super_MessageLite._internal_metadata_.ptr_;
  if (((ulong)pvVar1 & 1) != 0) {
    internal::InternalMetadata::DoMergeFrom<google::protobuf::UnknownFieldSet>
              (this_00,(UnknownFieldSet *)(((ulong)pvVar1 & 0xfffffffffffffffe) + 8));
  }
  (this->name_).ptr_ = (string *)&internal::fixed_address_empty_string_abi_cxx11_;
  initial_value = (from->name_).ptr_;
  if (initial_value->_M_string_length != 0) {
    arena = (Arena *)this_00->ptr_;
    if (((ulong)arena & 1) != 0) {
      arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
    }
    internal::ArenaStringPtr::CreateInstance(&this->name_,arena,initial_value);
  }
  this->number_ = from->number_;
  return;
}

Assistant:

EnumValue::EnumValue(const EnumValue& from)
  : ::PROTOBUF_NAMESPACE_ID::Message(),
      options_(from.options_) {
  _internal_metadata_.MergeFrom<::PROTOBUF_NAMESPACE_ID::UnknownFieldSet>(from._internal_metadata_);
  name_.UnsafeSetDefault(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited());
  if (!from._internal_name().empty()) {
    name_.Set(&::PROTOBUF_NAMESPACE_ID::internal::GetEmptyStringAlreadyInited(), from._internal_name(),
      GetArena());
  }
  number_ = from.number_;
  // @@protoc_insertion_point(copy_constructor:google.protobuf.EnumValue)
}